

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

lyd_node * lyd_new_path_update(lyd_node *node,void *value,LYD_ANYDATA_VALUETYPE value_type,int dflt)

{
  LYS_NODE LVar1;
  ly_ctx *ctx_00;
  int iVar2;
  hash_table *phVar3;
  int len;
  lyd_node_anydata *any;
  ly_ctx *ctx;
  int dflt_local;
  LYD_ANYDATA_VALUETYPE value_type_local;
  void *value_local;
  lyd_node *node_local;
  
  ctx_00 = node->schema->module->ctx;
  LVar1 = node->schema->nodetype;
  if (LVar1 == LYS_LEAF) {
    if (LYD_ANYDATA_STRING < value_type) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_new_path_update");
      return (lyd_node *)0x0;
    }
    iVar2 = lyd_change_leaf((lyd_node_leaf_list *)node,(char *)value);
    if (iVar2 == 0) {
      if (dflt == 0) {
        return node;
      }
      node->field_0x9 = node->field_0x9 & 0xfe | 1;
      return node;
    }
    if (dflt != 0) {
      node->field_0x9 = node->field_0x9 & 0xfe | 1;
      return node;
    }
  }
  else if ((LVar1 == LYS_ANYXML) || (LVar1 == LYS_ANYDATA)) {
    if ((*(uint *)&node->field_0x34 < 2) && (value_type < LYD_ANYDATA_JSON)) {
      iVar2 = ly_strequal_((char *)node->ht,(char *)value);
      if (iVar2 != 0) {
        return (lyd_node *)0x0;
      }
    }
    else if ((*(LYD_ANYDATA_VALUETYPE *)&node->field_0x34 == value_type) &&
            (node->ht == (hash_table *)value)) {
      return (lyd_node *)0x0;
    }
    switch(*(undefined4 *)&node->field_0x34) {
    case 0:
    case 2:
    case 4:
      lydict_remove(ctx_00,(char *)node->ht);
      break;
    case 1:
    case 3:
    case 5:
    case 0x21:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                    ,0x718,
                    "struct lyd_node *lyd_new_path_update(struct lyd_node *, void *, LYD_ANYDATA_VALUETYPE, int)"
                   );
    case 8:
      lyxml_free_withsiblings(ctx_00,(lyxml_elem *)node->ht);
      break;
    case 0x10:
      lyd_free_withsiblings((lyd_node *)node->ht);
      break;
    case 0x20:
      free(node->ht);
    }
    switch(value_type) {
    case LYD_ANYDATA_CONSTSTRING:
    case LYD_ANYDATA_JSON:
    case LYD_ANYDATA_SXML:
      phVar3 = (hash_table *)lydict_insert(ctx_00,(char *)value,0);
      node->ht = phVar3;
      break;
    case LYD_ANYDATA_STRING:
    case LYD_ANYDATA_JSOND:
    case LYD_ANYDATA_SXMLD:
      phVar3 = (hash_table *)lydict_insert_zc(ctx_00,(char *)value);
      node->ht = phVar3;
      break;
    case LYD_ANYDATA_XML:
      node->ht = (hash_table *)value;
      break;
    case LYD_ANYDATA_DATATREE:
      node->ht = (hash_table *)value;
      break;
    case LYD_ANYDATA_LYB:
      iVar2 = lyd_lyb_data_length((char *)value);
      if (iVar2 == -1) {
        ly_log(ctx_00,LY_LLERR,LY_EINVAL,"Invalid LYB data.");
        return (lyd_node *)0x0;
      }
      phVar3 = (hash_table *)malloc((long)iVar2);
      node->ht = phVar3;
      if (node->ht == (hash_table *)0x0) {
        ly_log(ctx_00,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_new_path_update");
        return (lyd_node *)0x0;
      }
      memcpy(node->ht,value,(long)iVar2);
      break;
    case LYD_ANYDATA_LYBD:
      node->ht = (hash_table *)value;
    }
    return node;
  }
  return (lyd_node *)0x0;
}

Assistant:

static struct lyd_node *
lyd_new_path_update(struct lyd_node *node, void *value, LYD_ANYDATA_VALUETYPE value_type, int dflt)
{
    struct ly_ctx *ctx = node->schema->module->ctx;
    struct lyd_node_anydata *any;
    int len;

    switch (node->schema->nodetype) {
    case LYS_LEAF:
        if (value_type > LYD_ANYDATA_STRING) {
            LOGARG;
            return NULL;
        }

        if (lyd_change_leaf((struct lyd_node_leaf_list *)node, value) == 0) {
            /* there was an actual change */
            if (dflt) {
                node->dflt = 1;
            }
            return node;
        }

        if (dflt) {
            /* maybe the value is the same, but the node is default now */
            node->dflt = 1;
            return node;
        }

        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        /* the nodes are the same if:
         * 1) the value types are strings (LYD_ANYDATA_STRING and LYD_ANYDATA_CONSTSTRING equals)
         *    and the strings equals
         * 2) the value types are the same, but not strings and the pointers (not the content) are the
         *    same
         */
        any = (struct lyd_node_anydata *)node;
        if (any->value_type <= LYD_ANYDATA_STRING && value_type <= LYD_ANYDATA_STRING) {
            if (ly_strequal(any->value.str, (char *)value, 0)) {
                /* values are the same */
                return NULL;
            }
        } else if (any->value_type == value_type) {
            /* compare pointers */
            if ((void *)any->value.tree == value) {
                /* values are the same */
                return NULL;
            }
        }

        /* values are not the same - 1) remove the old one ... */
        switch (any->value_type) {
        case LYD_ANYDATA_CONSTSTRING:
        case LYD_ANYDATA_SXML:
        case LYD_ANYDATA_JSON:
            lydict_remove(ctx, any->value.str);
            break;
        case LYD_ANYDATA_DATATREE:
            lyd_free_withsiblings(any->value.tree);
            break;
        case LYD_ANYDATA_XML:
            lyxml_free_withsiblings(ctx, any->value.xml);
            break;
        case LYD_ANYDATA_LYB:
            free(any->value.mem);
            break;
        case LYD_ANYDATA_STRING:
        case LYD_ANYDATA_SXMLD:
        case LYD_ANYDATA_JSOND:
        case LYD_ANYDATA_LYBD:
            /* dynamic strings are used only as input parameters */
            assert(0);
            break;
        }
        /* ... and 2) store the new one */
        switch (value_type) {
        case LYD_ANYDATA_CONSTSTRING:
        case LYD_ANYDATA_SXML:
        case LYD_ANYDATA_JSON:
            any->value.str = lydict_insert(ctx, (const char *)value, 0);
            break;
        case LYD_ANYDATA_STRING:
        case LYD_ANYDATA_SXMLD:
        case LYD_ANYDATA_JSOND:
            any->value.str = lydict_insert_zc(ctx, (char *)value);
            value_type &= ~LYD_ANYDATA_STRING; /* make const string from string */
            break;
        case LYD_ANYDATA_DATATREE:
            any->value.tree = value;
            break;
        case LYD_ANYDATA_XML:
            any->value.xml = value;
            break;
        case LYD_ANYDATA_LYB:
            len = lyd_lyb_data_length(value);
            if (len == -1) {
                LOGERR(ctx, LY_EINVAL, "Invalid LYB data.");
                return NULL;
            }
            any->value.mem = malloc(len);
            LY_CHECK_ERR_RETURN(!any->value.mem, LOGMEM(ctx), NULL);
            memcpy(any->value.mem, value, len);
            break;
        case LYD_ANYDATA_LYBD:
            any->value.mem = value;
            value_type &= ~LYD_ANYDATA_STRING; /* make const string from string */
            break;
        }
        return node;
    default:
        /* nothing needed - containers, lists and leaf-lists do not have value or it cannot be changed */
        break;
    }

    /* not updated */
    return NULL;
}